

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::BiasLayerParams::Clear(BiasLayerParams *this)

{
  ulong uVar1;
  WeightParams *this_00;
  undefined8 *puVar2;
  
  (this->shape_).current_size_ = 0;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->bias_, this_00 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(this_00);
    operator_delete(this_00,0x48);
  }
  this->bias_ = (WeightParams *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BiasLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BiasLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  shape_.Clear();
  if (GetArenaForAllocation() == nullptr && bias_ != nullptr) {
    delete bias_;
  }
  bias_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}